

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

uint8_t * __thiscall
icu_63::Normalizer2Impl::decomposeShort
          (Normalizer2Impl *this,uint8_t *src,uint8_t *limit,UBool stopAtCompBoundary,
          UBool onlyContiguous,ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  ushort uVar1;
  uint8_t *cpStart;
  UBool UVar2;
  uint8_t cc;
  int iVar3;
  uint lt1;
  UChar32 c_00;
  int32_t iVar4;
  uint16_t *puVar5;
  byte *pbVar6;
  int local_7c;
  uint8_t local_6a;
  uint8_t leadCC;
  uint8_t trailCC;
  int32_t length;
  uint16_t firstUnit;
  uint16_t *mapping;
  char16_t cStack_50;
  char16_t jamos [3];
  UChar32 c;
  uint8_t __t3;
  uint8_t __t2;
  uint8_t __t1;
  int32_t __lead;
  uint16_t norm16;
  uint8_t *prevSrc;
  ReorderingBuffer *buffer_local;
  UBool onlyContiguous_local;
  UBool stopAtCompBoundary_local;
  uint8_t *limit_local;
  uint8_t *src_local;
  Normalizer2Impl *this_local;
  
  UVar2 = ::U_FAILURE(*errorCode);
  limit_local = src;
  if (UVar2 != '\0') {
    return (uint8_t *)0x0;
  }
LAB_00333ebe:
  do {
    cpStart = limit_local;
    if (limit <= limit_local) {
      return limit_local;
    }
    pbVar6 = limit_local + 1;
    c = (UChar32)*limit_local;
    if ((*limit_local & 0x80) != 0) {
      if (pbVar6 != limit) {
        if ((uint)c < 0xe0) {
          if ((0xc1 < (uint)c) && (jamos[2]._1_1_ = *pbVar6 + 0x80, jamos[2]._1_1_ < 0x40)) {
            c = (uint)this->normTrie->index[(int)(c & 0x1f)] + (uint)jamos[2]._1_1_;
            limit_local = pbVar6;
LAB_0033411c:
            pbVar6 = limit_local + 1;
            goto LAB_0033413d;
          }
        }
        else if ((uint)c < 0xf0) {
          jamos[2]._1_1_ = *pbVar6;
          if (((((int)" 000000000000\x1000"[(int)(c & 0xfU)] &
                1 << (sbyte)((int)(uint)jamos[2]._1_1_ >> 5)) != 0) &&
              (pbVar6 = limit_local + 2, pbVar6 != limit)) &&
             (jamos[2]._0_1_ = *pbVar6 + 0x80, (byte)jamos[2] < 0x40)) {
            c = (uint)this->normTrie->index[(int)((c & 0xfU) * 0x40 + (jamos[2]._1_1_ & 0x3f))] +
                (uint)(byte)jamos[2];
            limit_local = pbVar6;
            goto LAB_0033411c;
          }
        }
        else {
          iVar3 = c - 0xf0;
          if ((iVar3 < 5) &&
             (jamos[2]._1_1_ = *pbVar6,
             ((int)""[(int)(uint)jamos[2]._1_1_ >> 4] & 1 << ((byte)iVar3 & 0x1f)) != 0)) {
            lt1 = iVar3 * 0x40 | jamos[2]._1_1_ & 0x3f;
            pbVar6 = limit_local + 2;
            if ((pbVar6 != limit) &&
               (((jamos[2]._0_1_ = *pbVar6 + 0x80, (byte)jamos[2] < 0x40 &&
                 (pbVar6 = limit_local + 3, pbVar6 != limit)) &&
                (jamos[1]._1_1_ = *pbVar6 + 0x80, jamos[1]._1_1_ < 0x40)))) {
              if ((int)lt1 < (int)(uint)this->normTrie->shifted12HighStart) {
                local_7c = ucptrie_internalSmallU8Index_63
                                     (this->normTrie,lt1,(byte)jamos[2],jamos[1]._1_1_);
              }
              else {
                local_7c = this->normTrie->dataLength + -2;
              }
              c = local_7c;
              limit_local = pbVar6;
              goto LAB_0033411c;
            }
          }
        }
      }
      limit_local = pbVar6;
      c = this->normTrie->dataLength + -1;
      pbVar6 = limit_local;
    }
LAB_0033413d:
    limit_local = pbVar6;
    ___t2 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)c * 2);
    cStack_50 = L'\xffff';
    jamos[0] = L'\xffff';
    if (___t2 < this->limitNoNo) {
      if ((stopAtCompBoundary != '\0') && (___t2 < this->minNoNoCompNoMaybeCC)) {
        return cpStart;
      }
    }
    else {
      UVar2 = isMaybeOrNonZeroCC(this,___t2);
      if (UVar2 != '\0') {
        c_00 = anon_unknown_15::codePointFromValidUTF8(cpStart,limit_local);
        _cStack_50 = c_00;
        cc = getCCFromYesOrMaybe(___t2);
        UVar2 = ReorderingBuffer::append(buffer,c_00,cc,errorCode);
        if (UVar2 == '\0') {
          return (uint8_t *)0x0;
        }
        goto LAB_00333ebe;
      }
      if (stopAtCompBoundary != '\0') {
        return cpStart;
      }
      _cStack_50 = anon_unknown_15::codePointFromValidUTF8(cpStart,limit_local);
      _cStack_50 = mapAlgorithmic(this,_cStack_50,___t2);
      ___t2 = getRawNorm16(this,_cStack_50);
    }
    if (___t2 < this->minYesNo) {
      if (_cStack_50 < 0) {
        _cStack_50 = anon_unknown_15::codePointFromValidUTF8(cpStart,limit_local);
      }
      UVar2 = ReorderingBuffer::append(buffer,_cStack_50,'\0',errorCode);
      if (UVar2 == '\0') {
        return (uint8_t *)0x0;
      }
    }
    else {
      UVar2 = isHangulLV(this,___t2);
      if ((UVar2 == '\0') && (UVar2 = isHangulLVT(this,___t2), UVar2 == '\0')) {
        puVar5 = getMapping(this,___t2);
        uVar1 = *puVar5;
        if ((uVar1 & 0x80) == 0) {
          local_6a = '\0';
        }
        else {
          local_6a = (uint8_t)(puVar5[-1] >> 8);
        }
        UVar2 = ReorderingBuffer::append
                          (buffer,(UChar *)(puVar5 + 1),uVar1 & 0x1f,'\x01',local_6a,
                           (uint8_t)(uVar1 >> 8),errorCode);
        if (UVar2 == '\0') {
          return (uint8_t *)0x0;
        }
      }
      else {
        if (_cStack_50 < 0) {
          _cStack_50 = anon_unknown_15::codePointFromValidUTF8(cpStart,limit_local);
        }
        iVar4 = Hangul::decompose(_cStack_50,(UChar *)((long)&mapping + 2));
        UVar2 = ReorderingBuffer::appendZeroCC
                          (buffer,(UChar *)((long)&mapping + 2),
                           (UChar *)((long)&mapping + (long)iVar4 * 2 + 2),errorCode);
        if (UVar2 == '\0') {
          return (uint8_t *)0x0;
        }
      }
    }
    if ((stopAtCompBoundary != '\0') &&
       (UVar2 = norm16HasCompBoundaryAfter(this,___t2,onlyContiguous), UVar2 != '\0')) {
      return limit_local;
    }
  } while( true );
}

Assistant:

const uint8_t *
Normalizer2Impl::decomposeShort(const uint8_t *src, const uint8_t *limit,
                                UBool stopAtCompBoundary, UBool onlyContiguous,
                                ReorderingBuffer &buffer, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) {
        return nullptr;
    }
    while (src < limit) {
        const uint8_t *prevSrc = src;
        uint16_t norm16;
        UCPTRIE_FAST_U8_NEXT(normTrie, UCPTRIE_16, src, limit, norm16);
        // Get the decomposition and the lead and trail cc's.
        UChar32 c = U_SENTINEL;
        if (norm16 >= limitNoNo) {
            if (isMaybeOrNonZeroCC(norm16)) {
                // No boundaries around this character.
                c = codePointFromValidUTF8(prevSrc, src);
                if (!buffer.append(c, getCCFromYesOrMaybe(norm16), errorCode)) {
                    return nullptr;
                }
                continue;
            }
            // Maps to an isCompYesAndZeroCC.
            if (stopAtCompBoundary) {
                return prevSrc;
            }
            c = codePointFromValidUTF8(prevSrc, src);
            c = mapAlgorithmic(c, norm16);
            norm16 = getRawNorm16(c);
        } else if (stopAtCompBoundary && norm16 < minNoNoCompNoMaybeCC) {
            return prevSrc;
        }
        // norm16!=INERT guarantees that [prevSrc, src[ is valid UTF-8.
        // We do not see invalid UTF-8 here because
        // its norm16==INERT is normalization-inert,
        // so it gets copied unchanged in the fast path,
        // and we stop the slow path where invalid UTF-8 begins.
        U_ASSERT(norm16 != INERT);
        if (norm16 < minYesNo) {
            if (c < 0) {
                c = codePointFromValidUTF8(prevSrc, src);
            }
            // does not decompose
            if (!buffer.append(c, 0, errorCode)) {
                return nullptr;
            }
        } else if (isHangulLV(norm16) || isHangulLVT(norm16)) {
            // Hangul syllable: decompose algorithmically
            if (c < 0) {
                c = codePointFromValidUTF8(prevSrc, src);
            }
            char16_t jamos[3];
            if (!buffer.appendZeroCC(jamos, jamos+Hangul::decompose(c, jamos), errorCode)) {
                return nullptr;
            }
        } else {
            // The character decomposes, get everything from the variable-length extra data.
            const uint16_t *mapping = getMapping(norm16);
            uint16_t firstUnit = *mapping;
            int32_t length = firstUnit & MAPPING_LENGTH_MASK;
            uint8_t trailCC = (uint8_t)(firstUnit >> 8);
            uint8_t leadCC;
            if (firstUnit & MAPPING_HAS_CCC_LCCC_WORD) {
                leadCC = (uint8_t)(*(mapping-1) >> 8);
            } else {
                leadCC = 0;
            }
            if (!buffer.append((const char16_t *)mapping+1, length, TRUE, leadCC, trailCC, errorCode)) {
                return nullptr;
            }
        }
        if (stopAtCompBoundary && norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
            return src;
        }
    }
    return src;
}